

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O3

void rr::readVertexAttrib(Vec4 *dst,VertexAttrib *vertexAttrib,int instanceNdx,int vertexNdx)

{
  uint uVar1;
  undefined8 uVar2;
  deUint32 aligned_3;
  int iVar3;
  uint uVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  uint *__src;
  size_t __n;
  float fVar6;
  float fVar7;
  float aligned [4];
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  ushort uStack_44;
  ushort uStack_42;
  float local_40;
  float fStack_3c;
  double local_38;
  double local_30;
  Float<unsigned_short,_5,_10,_15,_3U> local_22;
  
  if (vertexAttrib->pointer == (void *)0x0) {
    uVar2 = *(undefined8 *)((long)&(vertexAttrib->generic).v + 8);
    *(undefined8 *)dst->m_data = *(undefined8 *)&(vertexAttrib->generic).v;
    *(undefined8 *)(dst->m_data + 2) = uVar2;
    return;
  }
  if (vertexAttrib->instanceDivisor != 0) {
    vertexNdx = instanceNdx / vertexAttrib->instanceDivisor;
  }
  iVar3 = anon_unknown_1::getComponentSize(vertexAttrib->type);
  iVar3 = iVar3 * vertexAttrib->size;
  if (vertexAttrib->stride != 0) {
    iVar3 = vertexAttrib->stride;
  }
  dst->m_data[0] = 0.0;
  dst->m_data[1] = 0.0;
  dst->m_data[2] = 0.0;
  dst->m_data[3] = 1.0;
  if (VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA < vertexAttrib->type) {
    return;
  }
  __src = (uint *)((long)(iVar3 * vertexNdx) + (long)vertexAttrib->pointer);
  uVar1 = vertexAttrib->size;
  __n = (size_t)(int)uVar1;
  switch(vertexAttrib->type) {
  case VERTEXATTRIBTYPE_FLOAT:
    memcpy(&local_48,__src,__n * 4);
    dst->m_data[0] = (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48)));
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT22(uStack_42,uStack_44);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = local_40;
    if (uVar1 < 4) {
      return;
    }
    break;
  case VERTEXATTRIBTYPE_HALF:
    memcpy(&local_48,__src,__n * 2);
    FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_22);
    dst->m_data[0] = (float)FVar5.m_value;
    if ((int)uVar1 < 2) {
      return;
    }
    FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_22);
    dst->m_data[1] = (float)FVar5.m_value;
    if (uVar1 == 2) {
      return;
    }
    local_22.m_value = uStack_44;
    FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_22);
    dst->m_data[2] = (float)FVar5.m_value;
    if (uVar1 < 4) {
      return;
    }
    local_22.m_value = uStack_42;
    FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_22);
    dst->m_data[3] = (float)FVar5.m_value;
    return;
  case VERTEXATTRIBTYPE_FIXED:
    memcpy(&local_48,__src,__n << 2);
    dst->m_data[0] =
         (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48))) * 1.5258789e-05
    ;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT22(uStack_42,uStack_44) * 1.5258789e-05;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(int)local_40 * 1.5258789e-05;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)fStack_3c * 1.5258789e-05;
    break;
  case VERTEXATTRIBTYPE_DOUBLE:
    memcpy(&local_48,__src,__n << 3);
    dst->m_data[0] =
         (float)(double)CONCAT26(uStack_42,
                                 CONCAT24(uStack_44,
                                          CONCAT13(bStack_45,
                                                   CONCAT12(bStack_46,CONCAT11(bStack_47,local_48)))
                                         ));
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(double)CONCAT44(fStack_3c,local_40);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)local_38;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)local_30;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM8:
    memcpy(&local_48,__src,__n);
    dst->m_data[0] = (float)local_48 / 255.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)bStack_47 / 255.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)bStack_46 / 255.0;
    goto LAB_001bf963;
  case VERTEXATTRIBTYPE_NONPURE_UNORM16:
    memcpy(&local_48,__src,__n * 2);
    dst->m_data[0] = (float)CONCAT11(bStack_47,local_48) / 65535.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT11(bStack_45,bStack_46) / 65535.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)uStack_44 / 65535.0;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)uStack_42;
    goto LAB_001bff7e;
  case VERTEXATTRIBTYPE_NONPURE_UNORM32:
    memcpy(&local_48,__src,__n << 2);
    dst->m_data[0] =
         (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48))) * 2.3283064e-10
    ;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT22(uStack_42,uStack_44) * 2.3283064e-10;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(uint)local_40 * 2.3283064e-10;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(uint)fStack_3c;
    goto LAB_001bfb82;
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV:
    uVar4 = *__src;
    dst->m_data[0] = (float)(uVar4 & 0x3ff) / 1023.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(uVar4 >> 10 & 0x3ff) / 1023.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(uVar4 >> 0x14 & 0x3ff) / 1023.0;
    goto LAB_001bf783;
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_CLAMP:
    memcpy(&local_48,__src,__n);
    fVar6 = -1.0;
    if (-1.0 <= (float)(int)(char)local_48 / 127.0) {
      fVar6 = (float)(int)(char)local_48 / 127.0;
    }
    dst->m_data[0] = fVar6;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar6 = -1.0;
    if (-1.0 <= (float)(int)(char)bStack_47 / 127.0) {
      fVar6 = (float)(int)(char)bStack_47 / 127.0;
    }
    dst->m_data[1] = fVar6;
    if (uVar1 == 2) {
      return;
    }
    fVar6 = -1.0;
    if (-1.0 <= (float)(int)(char)bStack_46 / 127.0) {
      fVar6 = (float)(int)(char)bStack_46 / 127.0;
    }
    dst->m_data[2] = fVar6;
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(int)(char)bStack_45 / 127.0;
    goto LAB_001c01b7;
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_CLAMP:
    memcpy(&local_48,__src,__n * 2);
    fVar7 = (float)(int)CONCAT11(bStack_47,local_48) / 32767.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[0] = fVar6;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar7 = (float)(int)CONCAT11(bStack_45,bStack_46) / 32767.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[1] = fVar6;
    if (uVar1 == 2) {
      return;
    }
    fVar6 = -1.0;
    if (-1.0 <= (float)(int)(short)uStack_44 / 32767.0) {
      fVar6 = (float)(int)(short)uStack_44 / 32767.0;
    }
    dst->m_data[2] = fVar6;
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(int)(short)uStack_42 / 32767.0;
    goto LAB_001c01b7;
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_CLAMP:
    memcpy(&local_48,__src,__n << 2);
    fVar7 = (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48))) *
            4.656613e-10;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[0] = fVar6;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar7 = (float)CONCAT22(uStack_42,uStack_44) * 4.656613e-10;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[1] = fVar6;
    if (uVar1 == 2) {
      return;
    }
    fVar6 = -1.0;
    if (-1.0 <= (float)(int)local_40 * 4.656613e-10) {
      fVar6 = (float)(int)local_40 * 4.656613e-10;
    }
    dst->m_data[2] = fVar6;
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(int)fStack_3c * 4.656613e-10;
    goto LAB_001c01b7;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP:
    uVar4 = *__src;
    fVar7 = (float)(int)((uVar4 & 0x3ff) - (uVar4 * 2 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[0] = fVar6;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar7 = (float)(int)((uVar4 >> 10 & 0x3ff) - (uVar4 >> 9 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[1] = fVar6;
    if (uVar1 == 2) {
      return;
    }
    fVar7 = (float)(int)((uVar4 >> 0x14 & 0x3ff) - (uVar4 >> 0x13 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[2] = fVar6;
    goto LAB_001c0199;
  case VERTEXATTRIBTYPE_NONPURE_SNORM8_SCALE:
    memcpy(&local_48,__src,__n);
    dst->m_data[0] = ((float)(int)(char)local_48 + (float)(int)(char)local_48 + 1.0) / 255.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = ((float)(int)(char)bStack_47 + (float)(int)(char)bStack_47 + 1.0) / 255.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = ((float)(int)(char)bStack_46 + (float)(int)(char)bStack_46 + 1.0) / 255.0;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)(char)bStack_45 + (float)(int)(char)bStack_45 + 1.0;
    goto LAB_001bf979;
  case VERTEXATTRIBTYPE_NONPURE_SNORM16_SCALE:
    memcpy(&local_48,__src,__n * 2);
    dst->m_data[0] =
         ((float)(int)CONCAT11(bStack_47,local_48) + (float)(int)CONCAT11(bStack_47,local_48) + 1.0)
         / 65535.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] =
         ((float)(int)CONCAT11(bStack_45,bStack_46) + (float)(int)CONCAT11(bStack_45,bStack_46) +
         1.0) / 65535.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = ((float)(int)(short)uStack_44 + (float)(int)(short)uStack_44 + 1.0) / 65535.0;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)(short)uStack_42 + (float)(int)(short)uStack_42 + 1.0;
LAB_001bff7e:
    fStack_3c = fStack_3c / 65535.0;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM32_SCALE:
    memcpy(&local_48,__src,__n << 2);
    fVar6 = (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48)));
    dst->m_data[0] = (fVar6 + fVar6 + 1.0) * 2.3283064e-10;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] =
         ((float)CONCAT22(uStack_42,uStack_44) + (float)CONCAT22(uStack_42,uStack_44) + 1.0) *
         2.3283064e-10;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = ((float)(int)local_40 + (float)(int)local_40 + 1.0) * 2.3283064e-10;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)fStack_3c + (float)(int)fStack_3c + 1.0;
LAB_001bfb82:
    fStack_3c = fStack_3c * 2.3283064e-10;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE:
    uVar4 = *__src;
    fVar6 = (float)(int)((uVar4 & 0x3ff) - (uVar4 * 2 & 0x400));
    dst->m_data[0] = (fVar6 + fVar6 + 1.0) / 1023.0;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 10 & 0x3ff) - (uVar4 >> 9 & 0x400));
    dst->m_data[1] = (fVar6 + fVar6 + 1.0) / 1023.0;
    if (uVar1 == 2) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 0x14 & 0x3ff) - (uVar4 >> 0x13 & 0x400));
    dst->m_data[2] = (fVar6 + fVar6 + 1.0) / 1023.0;
    goto LAB_001c00b4;
  case VERTEXATTRIBTYPE_NONPURE_UINT8:
    memcpy(&local_48,__src,__n);
    dst->m_data[0] = (float)local_48;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)bStack_47;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)bStack_46;
    if (uVar1 < 4) {
      return;
    }
    uVar4 = (uint)bStack_45;
    goto LAB_001bfff0;
  case VERTEXATTRIBTYPE_NONPURE_UINT16:
    memcpy(&local_48,__src,__n * 2);
    dst->m_data[0] = (float)CONCAT11(bStack_47,local_48);
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT11(bStack_45,bStack_46);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)uStack_44;
    if (uVar1 < 4) {
      return;
    }
    uVar4 = (uint)uStack_42;
    goto LAB_001bfff0;
  case VERTEXATTRIBTYPE_NONPURE_UINT32:
    memcpy(&local_48,__src,__n << 2);
    dst->m_data[0] = (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48)));
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT22(uStack_42,uStack_44);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(uint)local_40;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(uint)fStack_3c;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT8:
    memcpy(&local_48,__src,__n);
    dst->m_data[0] = (float)(int)(char)local_48;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(int)(char)bStack_47;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(int)(char)bStack_46;
    if (uVar1 < 4) {
      return;
    }
    uVar4 = (uint)(char)bStack_45;
    goto LAB_001bfff0;
  case VERTEXATTRIBTYPE_NONPURE_INT16:
    memcpy(&local_48,__src,__n * 2);
    dst->m_data[0] = (float)(int)CONCAT11(bStack_47,local_48);
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(int)CONCAT11(bStack_45,bStack_46);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(int)(short)uStack_44;
    if (uVar1 < 4) {
      return;
    }
    uVar4 = (uint)(short)uStack_42;
    goto LAB_001bfff0;
  case VERTEXATTRIBTYPE_NONPURE_INT32:
    memcpy(&local_48,__src,__n << 2);
    dst->m_data[0] = (float)CONCAT13(bStack_45,CONCAT12(bStack_46,CONCAT11(bStack_47,local_48)));
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)CONCAT22(uStack_42,uStack_44);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(int)local_40;
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)fStack_3c;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV:
    uVar4 = *__src;
    dst->m_data[0] = (float)(uVar4 & 0x3ff);
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(uVar4 >> 10 & 0x3ff);
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(uVar4 >> 0x14 & 0x3ff);
    if (uVar1 < 4) {
      return;
    }
    uVar4 = uVar4 >> 0x1e;
LAB_001bfff0:
    fStack_3c = (float)(int)uVar4;
    break;
  case VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV:
    uVar4 = *__src;
    dst->m_data[0] = (float)(int)((uVar4 & 0x3ff) - (uVar4 * 2 & 0x400));
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(int)((uVar4 >> 10 & 0x3ff) - (uVar4 >> 9 & 0x400));
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[2] = (float)(int)((uVar4 >> 0x14 & 0x3ff) - (uVar4 >> 0x13 & 0x400));
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)(int)((uVar4 >> 0x1e) - (uVar4 >> 0x1d & 0xfffffffc));
    break;
  default:
    goto switchD_001bf20e_caseD_18;
  case VERTEXATTRIBTYPE_NONPURE_UNORM8_BGRA:
    memcpy(&local_48,__src,__n);
    dst->m_data[2] = (float)local_48 / 255.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)bStack_47 / 255.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[0] = (float)bStack_46 / 255.0;
LAB_001bf963:
    if (uVar1 < 4) {
      return;
    }
    fStack_3c = (float)bStack_45;
LAB_001bf979:
    fStack_3c = fStack_3c / 255.0;
    break;
  case VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA:
    uVar4 = *__src;
    dst->m_data[2] = (float)(uVar4 & 0x3ff) / 1023.0;
    if ((int)uVar1 < 2) {
      return;
    }
    dst->m_data[1] = (float)(uVar4 >> 10 & 0x3ff) / 1023.0;
    if (uVar1 == 2) {
      return;
    }
    dst->m_data[0] = (float)(uVar4 >> 0x14 & 0x3ff) / 1023.0;
LAB_001bf783:
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(uVar4 >> 0x1e);
LAB_001c00de:
    fStack_3c = fVar6 / 3.0;
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA:
    uVar4 = *__src;
    fVar7 = (float)(int)((uVar4 & 0x3ff) - (uVar4 * 2 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[2] = fVar6;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar7 = (float)(int)((uVar4 >> 10 & 0x3ff) - (uVar4 >> 9 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[1] = fVar6;
    if (uVar1 == 2) {
      return;
    }
    fVar7 = (float)(int)((uVar4 >> 0x14 & 0x3ff) - (uVar4 >> 0x13 & 0x400)) / 511.0;
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    dst->m_data[0] = fVar6;
LAB_001c0199:
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 0x1e) - (uVar4 >> 0x1d & 0xfffffffc));
LAB_001c01b7:
    fStack_3c = -1.0;
    if (-1.0 <= fVar6) {
      fStack_3c = fVar6;
    }
    break;
  case VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA:
    uVar4 = *__src;
    fVar6 = (float)(int)((uVar4 & 0x3ff) - (uVar4 * 2 & 0x400));
    dst->m_data[2] = (fVar6 + fVar6 + 1.0) / 1023.0;
    if ((int)uVar1 < 2) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 10 & 0x3ff) - (uVar4 >> 9 & 0x400));
    dst->m_data[1] = (fVar6 + fVar6 + 1.0) / 1023.0;
    if (uVar1 == 2) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 0x14 & 0x3ff) - (uVar4 >> 0x13 & 0x400));
    dst->m_data[0] = (fVar6 + fVar6 + 1.0) / 1023.0;
LAB_001c00b4:
    if (uVar1 < 4) {
      return;
    }
    fVar6 = (float)(int)((uVar4 >> 0x1e) - (uVar4 >> 0x1d & 0xfffffffc));
    fVar6 = fVar6 + fVar6 + 1.0;
    goto LAB_001c00de;
  }
  dst->m_data[3] = fStack_3c;
switchD_001bf20e_caseD_18:
  return;
}

Assistant:

void readVertexAttrib (tcu::Vec4& dst, const VertexAttrib& vertexAttrib, const int instanceNdx, const int vertexNdx)
{
	DE_ASSERT(isValidVertexAttrib(vertexAttrib));

	if (vertexAttrib.pointer)
	{
		const int	elementNdx		= (vertexAttrib.instanceDivisor != 0) ? (instanceNdx / vertexAttrib.instanceDivisor) : vertexNdx;
		const int	compSize		= getComponentSize(vertexAttrib.type);
		const int	stride			= (vertexAttrib.stride != 0) ? (vertexAttrib.stride) : (vertexAttrib.size*compSize);
		const int	byteOffset		= elementNdx*stride;

		dst = tcu::Vec4(0, 0, 0, 1); // defaults
		readFloat(dst, vertexAttrib.type, vertexAttrib.size, (const deUint8*)vertexAttrib.pointer + byteOffset);
	}
	else
	{
		dst = vertexAttrib.generic.get<float>();
	}
}